

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

CBlock * CreateGenesisBlock(CBlock *__return_storage_ptr__,char *pszTimestamp,
                           CScript *genesisOutputScript,uint32_t nTime,uint32_t nNonce,
                           uint32_t nBits,int32_t nVersion,CAmount *genesisReward)

{
  uint256 *puVar1;
  base_blob<256U> *pbVar2;
  CScript *pCVar3;
  size_t sVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  undefined4 in_stack_0000000c;
  CMutableTransaction txNew;
  allocator_type local_b1;
  pointer local_b0;
  long local_a8;
  long local_a0;
  CScriptNum local_98;
  CMutableTransaction local_90;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_90);
  local_90.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&local_90.vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_90.vout,1);
  local_58._16_8_ = 0;
  uStack_40 = 0;
  local_58._0_8_ = (char *)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pCVar3 = CScript::push_int64((CScript *)local_58,0x1d00ffff);
  local_98.m_value = 4;
  pCVar3 = CScript::operator<<(pCVar3,&local_98);
  sVar4 = strlen(pszTimestamp);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_b0,(uchar *)pszTimestamp,
             (uchar *)(pszTimestamp + sVar4),&local_b1);
  b._M_extent._M_extent_value = local_a8 - (long)local_b0;
  b._M_ptr = local_b0;
  other = &CScript::operator<<(pCVar3,b)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,other);
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0,local_a0 - (long)local_b0);
  }
  if (0x1c < uStack_40._4_4_) {
    free((void *)local_58._0_8_);
    local_58._0_8_ = (char *)0x0;
  }
  (local_90.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start)->nValue = *(CAmount *)CONCAT44(in_stack_0000000c,nVersion);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_90.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &genesisOutputScript->super_CScriptBase);
  __return_storage_ptr__->m_checked_witness_commitment = false;
  __return_storage_ptr__->m_checked_merkle_root = false;
  (__return_storage_ptr__->super_CBlockHeader).nVersion = 0;
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [0] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [1] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [2] = '\0';
  (__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
  [3] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[4] = '\0';
  (pbVar2->m_data)._M_elems[5] = '\0';
  (pbVar2->m_data)._M_elems[6] = '\0';
  (pbVar2->m_data)._M_elems[7] = '\0';
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems
   + 0x1c) = 0;
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[4] = '\0';
  (pbVar2->m_data)._M_elems[5] = '\0';
  (pbVar2->m_data)._M_elems[6] = '\0';
  (pbVar2->m_data)._M_elems[7] = '\0';
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x1c) = 0;
  (__return_storage_ptr__->super_CBlockHeader).nBits = 0;
  (__return_storage_ptr__->super_CBlockHeader).nNonce = 0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vtx).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(&__return_storage_ptr__->vtx);
  __return_storage_ptr__->fChecked = false;
  __return_storage_ptr__->m_checked_witness_commitment = false;
  __return_storage_ptr__->m_checked_merkle_root = false;
  (__return_storage_ptr__->super_CBlockHeader).nTime = nTime;
  (__return_storage_ptr__->super_CBlockHeader).nBits = nBits;
  (__return_storage_ptr__->super_CBlockHeader).nNonce = nNonce;
  (__return_storage_ptr__->super_CBlockHeader).nVersion = 1;
  local_58._0_8_ = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),(CTransaction **)local_58,
             (allocator<CTransaction> *)&local_b0,&local_90);
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
              *)&__return_storage_ptr__->vtx,(shared_ptr<const_CTransaction> *)local_58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x10] = '\0';
  (pbVar2->m_data)._M_elems[0x11] = '\0';
  (pbVar2->m_data)._M_elems[0x12] = '\0';
  (pbVar2->m_data)._M_elems[0x13] = '\0';
  (pbVar2->m_data)._M_elems[0x14] = '\0';
  (pbVar2->m_data)._M_elems[0x15] = '\0';
  (pbVar2->m_data)._M_elems[0x16] = '\0';
  (pbVar2->m_data)._M_elems[0x17] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[0x18] = '\0';
  (pbVar2->m_data)._M_elems[0x19] = '\0';
  (pbVar2->m_data)._M_elems[0x1a] = '\0';
  (pbVar2->m_data)._M_elems[0x1b] = '\0';
  (pbVar2->m_data)._M_elems[0x1c] = '\0';
  (pbVar2->m_data)._M_elems[0x1d] = '\0';
  (pbVar2->m_data)._M_elems[0x1e] = '\0';
  (pbVar2->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar2 = &(__return_storage_ptr__->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  BlockMerkleRoot((uint256 *)local_58,__return_storage_ptr__,(bool *)0x0);
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x10) = local_58._16_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 0x18) = uStack_40;
  *(undefined8 *)
   (__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
       = local_58._0_8_;
  *(undefined8 *)
   ((__return_storage_ptr__->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
    _M_elems + 8) = local_58._8_8_;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_90.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_90.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CBlock CreateGenesisBlock(const char* pszTimestamp, const CScript& genesisOutputScript, uint32_t nTime, uint32_t nNonce, uint32_t nBits, int32_t nVersion, const CAmount& genesisReward)
{
    CMutableTransaction txNew;
    txNew.version = 1;
    txNew.vin.resize(1);
    txNew.vout.resize(1);
    txNew.vin[0].scriptSig = CScript() << 486604799 << CScriptNum(4) << std::vector<unsigned char>((const unsigned char*)pszTimestamp, (const unsigned char*)pszTimestamp + strlen(pszTimestamp));
    txNew.vout[0].nValue = genesisReward;
    txNew.vout[0].scriptPubKey = genesisOutputScript;

    CBlock genesis;
    genesis.nTime    = nTime;
    genesis.nBits    = nBits;
    genesis.nNonce   = nNonce;
    genesis.nVersion = nVersion;
    genesis.vtx.push_back(MakeTransactionRef(std::move(txNew)));
    genesis.hashPrevBlock.SetNull();
    genesis.hashMerkleRoot = BlockMerkleRoot(genesis);
    return genesis;
}